

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  StringPiece *prefix;
  StringPiece *extraout_RDX;
  uint uVar5;
  string dmin;
  string pmax;
  string pmin;
  string dmax;
  string local_e8;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  string *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  string local_80;
  undefined1 *local_60;
  undefined4 local_58;
  string local_50;
  
  if (this->prog_ == (Prog *)0x0) {
    return false;
  }
  uVar5 = (uint)(this->prefix_)._M_string_length;
  if (maxlen <= (int)uVar5) {
    uVar5 = maxlen;
  }
  local_a0 = local_90;
  local_98 = 0;
  local_c8 = local_b8;
  local_c0 = 0;
  local_90[0] = 0;
  local_b8[0] = 0;
  local_a8 = max;
  std::__cxx11::string::substr((ulong)&local_e8,(ulong)&this->prefix_);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::substr((ulong)&local_e8,(ulong)&this->prefix_);
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  psVar1 = local_a8;
  if (this->prefix_foldcase_ == true) {
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = (ulong)uVar5;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      if ((byte)(local_a0[uVar3] + 0x9f) < 0x1a) {
        local_a0[uVar3] = local_a0[uVar3] + -0x20;
      }
    }
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  prefix = (StringPiece *)0x0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_80.field_2._M_local_buf[0] = '\0';
  if ((maxlen - uVar5 == 0 || maxlen < (int)uVar5) ||
     (bVar2 = Prog::PossibleMatchRange(this->prog_,&local_e8,&local_80,maxlen - uVar5),
     prefix = extraout_RDX, !bVar2)) {
    if (local_c0 == 0) {
      std::__cxx11::string::assign((char *)min);
      std::__cxx11::string::assign((char *)psVar1);
      bVar2 = false;
      goto LAB_00129634;
    }
    local_60 = local_c8;
    local_58 = (undefined4)local_c0;
    PrefixSuccessor_abi_cxx11_(&local_50,(re2 *)&local_60,prefix);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::append((string *)&local_a0);
    std::__cxx11::string::append((string *)&local_c8);
  }
  std::__cxx11::string::_M_assign((string *)min);
  bVar2 = true;
  std::__cxx11::string::_M_assign((string *)psVar1);
LAB_00129634:
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar2;
}

Assistant:

bool RE2::PossibleMatchRange(string* min, string* max, int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  string pmin, pmax;
  pmin = prefix_.substr(0, n);
  pmax = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change pmin to uppercase.
    for (int i = 0; i < n; i++) {
      if ('a' <= pmin[i] && pmin[i] <= 'z')
        pmin[i] += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    pmin += dmin;
    pmax += dmax;
  } else if (pmax.size() > 0) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up pmax to allow any possible suffix.
    pmax = PrefixSuccessor(pmax);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  *min = pmin;
  *max = pmax;
  return true;
}